

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> __thiscall
Parser::parseCommandSequence(Parser *this,char indicator,initializer_list<const_char_*> terminators)

{
  size_t __n;
  char *__s;
  bool bVar1;
  int iVar2;
  Token *pTVar3;
  size_t sVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  vector<std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>,_std::allocator<std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>_>_>
  *this_00;
  pointer *__ptr;
  bool bVar5;
  long lVar6;
  undefined7 in_register_00000031;
  Parser *this_01;
  iterator this_02;
  long in_R8;
  size_type __rlen;
  string expected;
  _Head_base<0UL,_CAssemblerCommand_*,_false> local_98;
  CommandSequence *local_90;
  long local_88;
  undefined1 local_80 [24];
  undefined1 local_68 [40];
  _Base_ptr local_40;
  _Base_ptr local_38;
  
  this_01 = (Parser *)CONCAT71(in_register_00000031,indicator);
  local_80._16_8_ = terminators._M_len;
  local_80._12_4_ = terminators._M_array._0_4_;
  local_88 = in_R8;
  local_68._32_8_ = this;
  local_90 = (CommandSequence *)operator_new(0x30);
  CommandSequence::CommandSequence(local_90);
  this_02._M_node =
       (_List_node_base *)
       (this_01->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
       _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer;
  if ((_List_node_base *)((TokenizerPosition *)&this_02._M_node[1]._M_prev)->it == this_02._M_node)
  {
LAB_00145e6f:
    if (local_88 != 0) {
      local_68._8_8_ = (pointer)0x0;
      local_68[0x10] = 0;
      lVar6 = 0;
      local_68._0_8_ = (pointer)(local_68 + 0x10);
      while( true ) {
        args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80._16_8_;
        if ((pointer)local_68._8_8_ != (pointer)0x0) {
          std::__cxx11::string::append(local_68);
        }
        std::__cxx11::string::append(local_68);
        if (local_88 * 8 + -8 == lVar6) break;
        lVar6 = lVar6 + 8;
      }
      Logger::printError<std::__cxx11::string>((Logger *)0x1,0x189c71,local_68,args);
      if ((pointer)local_68._0_8_ != (pointer)(local_68 + 0x10)) {
        operator_delete((void *)local_68._0_8_,CONCAT71(local_68._17_7_,local_68[0x10]) + 1);
      }
    }
LAB_00145f0e:
    *(_func_int ***)local_68._32_8_ = (_func_int **)local_90;
    return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
           (tuple<CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>)local_68._32_8_;
  }
  this_00 = &local_90->commands;
  local_38 = (_Base_ptr)(local_88 * 8);
LAB_00145cff:
  pTVar3 = Tokenizer::peekToken((Tokenizer *)this_02._M_node,0);
  if (pTVar3->type == Identifier) {
    if ((pTVar3->value).super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
        .super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
        super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
        super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
        super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
        super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
        _M_index != '\x04') {
      __assert_fail("std::holds_alternative<Identifier>(value)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/Parser/Tokenizer.h"
                    ,0x4d,"const Identifier &Token::identifierValue() const");
    }
    local_40 = *(_Base_ptr *)
                &(pTVar3->value).
                 super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                 ._M_u;
    if ((char)local_40->_M_color == (char)local_80._12_4_ && local_88 != 0) {
      __n = *(size_t *)
             ((long)&(pTVar3->value).
                     super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                     super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                     .
                     super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                     .
                     super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                     .
                     super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                     .
                     super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                     ._M_u + 8);
      lVar6 = 0;
      do {
        __s = *(char **)((long)&((_Alloc_hider *)local_80._16_8_)->_M_p + lVar6);
        sVar4 = strlen(__s);
        if (__n == sVar4) {
          if (__n == 0) goto LAB_00145f0e;
          iVar2 = bcmp(local_40,__s,__n);
          if (iVar2 == 0) goto LAB_00145f0e;
        }
        lVar6 = lVar6 + 8;
      } while (local_38 != (_Base_ptr)lVar6);
    }
LAB_00145d9f:
    bVar5 = false;
LAB_00145da1:
    bVar1 = checkEquLabel(this_01);
    if (!bVar1) {
      bVar1 = checkMacroDefinition(this_01);
      if (!bVar1) {
        bVar1 = checkExpFuncDefinition(this_01);
        if (!bVar1) goto LAB_00145e00;
      }
    }
    bVar5 = true;
    if (this_01->error == true) {
      handleError((Parser *)local_80);
      std::
      vector<std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>,std::allocator<std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>>>
      ::emplace_back<std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>>
                ((vector<std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>,std::allocator<std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>>>
                  *)this_00,
                 (unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> *)local_80)
      ;
      if ((pointer)local_80._0_8_ != (pointer)0x0) {
        (*(code *)((*(Tokenizer **)local_80._0_8_)->tokens).
                  super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
                  super__List_node_base._M_prev)();
      }
      local_80._0_8_ = (pointer)0x0;
    }
    goto LAB_00145da1;
  }
  if (pTVar3->type != Separator) goto LAB_00145d9f;
  Tokenizer::eatTokens
            ((this_01->entries).
             super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
             super__Vector_impl_data._M_finish[-1].tokenizer,1);
  goto LAB_00145e5d;
LAB_00145e00:
  if (!bVar5) {
    parseCommand((Parser *)local_68);
    if ((this_01->conditionStack).
        super__Vector_base<Parser::ConditionInfo,_std::allocator<Parser::ConditionInfo>_>._M_impl.
        super__Vector_impl_data._M_finish[-1].inTrueBlock == false) {
      if ((CAssemblerCommand *)local_68._0_8_ != (CAssemblerCommand *)0x0) {
        (*(*(_func_int ***)local_68._0_8_)[1])();
      }
    }
    else {
      local_98._M_head_impl = (CAssemblerCommand *)local_68._0_8_;
      std::
      vector<std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>,std::allocator<std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>>>
      ::emplace_back<std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>>
                ((vector<std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>,std::allocator<std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>>>
                  *)this_00,
                 (unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> *)&local_98
                );
      if (local_98._M_head_impl != (CAssemblerCommand *)0x0) {
        (*(local_98._M_head_impl)->_vptr_CAssemblerCommand[1])();
      }
      local_98._M_head_impl = (CAssemblerCommand *)0x0;
    }
  }
LAB_00145e5d:
  this_02._M_node =
       (_List_node_base *)
       (this_01->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
       _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer;
  if ((_List_node_base *)((TokenizerPosition *)&this_02._M_node[1]._M_prev)->it == this_02._M_node)
  goto LAB_00145e6f;
  goto LAB_00145cff;
}

Assistant:

std::unique_ptr<CAssemblerCommand> Parser::parseCommandSequence(char indicator, const std::initializer_list<const char*> terminators)
{
	auto sequence = std::make_unique<CommandSequence>();

	bool foundTermination = false;
	while (!atEnd())
	{
		const Token &next = peekToken();

		if(next.type == TokenType::Separator)
		{
			eatToken();
			continue;
		}

		if (next.type == TokenType::Identifier)
		{
			const auto &identifier = next.identifierValue();
			if (identifier.startsWith(indicator) && isPartOfList(identifier, terminators))
			{
				foundTermination = true;
				break;
			}
		}

		bool foundSomething = false;
		while (checkEquLabel() || checkMacroDefinition() || checkExpFuncDefinition())
		{
			// do nothing, just parse all the equs and macros there are
			if (hasError())
				sequence->addCommand(handleError());

			foundSomething = true;
		}

		if (foundSomething)
			continue;

		std::unique_ptr<CAssemblerCommand> cmd = parseCommand();

		// omit commands inside blocks that are trivially false
		if (!isInsideTrueBlock())
		{
			continue;
		}

		sequence->addCommand(std::move(cmd));
	}

	if (!foundTermination && terminators.size())
	{
		std::string expected;
		for (const char* terminator : terminators)
		{
			if (!expected.empty())
				expected += ", ";
			expected += terminator;
		}

		Logger::printError(Logger::Error, "Unterminated command sequence, expected any of %s.", expected);
	}

	return sequence;
}